

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Node::DumpBinary(Node *this,StreamWriterLE *s)

{
  bool bVar1;
  size_type num_properties;
  byte local_19;
  StreamWriterLE *s_local;
  Node *this_local;
  
  BeginBinary(this,s);
  DumpPropertiesBinary(this,s);
  num_properties =
       std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
       ::size(&this->properties);
  EndPropertiesBinary(this,s,num_properties);
  DumpChildrenBinary(this,s);
  local_19 = 1;
  if ((this->force_has_children & 1U) == 0) {
    bVar1 = std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::empty
                      (&this->children);
    local_19 = bVar1 ^ 0xff;
  }
  EndBinary(this,s,(bool)(local_19 & 1));
  return;
}

Assistant:

void FBX::Node::DumpBinary(Assimp::StreamWriterLE &s)
{
    // write header section (with placeholders for some things)
    BeginBinary(s);

    // write properties
    DumpPropertiesBinary(s);

    // go back and fill in property related placeholders
    EndPropertiesBinary(s, properties.size());

    // write children
    DumpChildrenBinary(s);

    // finish, filling in end offset placeholder
    EndBinary(s, force_has_children || !children.empty());
}